

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
OP_CallIExtendedFlags<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  CallFlags flags;
  Var target;
  RecyclableObject *function;
  AuxArray<unsigned_int> *spreadIndices;
  
  target = GetRegAllowStackVar<unsigned_int>
                     (this,(playout->
                           super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                           super_OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>.Function)
  ;
  function = OP_CallGetFunc(this,target);
  flags = playout->callFlags;
  if (((playout->super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).Options &
      CallIExtended_SpreadArgs) == CallIExtended_None) {
    spreadIndices = (AuxArray<unsigned_int> *)0x0;
  }
  else {
    spreadIndices =
         ByteCodeReader::ReadAuxArray<unsigned_int>
                   ((playout->
                    super_OpLayoutT_CallIExtended<Js::LayoutSizePolicy<(Js::LayoutSize)2>_>).
                    SpreadAuxOffset,*(FunctionBody **)(this + 0x88));
  }
  OP_CallCommon<Js::OpLayoutT_CallIExtendedFlags<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
            (this,playout,function,flags,spreadIndices);
  return;
}

Assistant:

void OP_CallIExtended(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), Js::CallFlags_None, (playout->Options & CallIExtended_SpreadArgs) ? m_reader.ReadAuxArray<uint32>(playout->SpreadAuxOffset, this->GetFunctionBody()) : nullptr); }